

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O2

ostream * operator<<(ostream *os,SequenceDistanceGraph *sdg)

{
  pointer pvVar1;
  pointer pLVar2;
  ostream *poVar3;
  vector<Link,_std::allocator<Link>_> *__range2;
  pointer __x;
  vector<Link,_std::allocator<Link>_> lv;
  _Vector_base<Link,_std::allocator<Link>_> local_48;
  
  pvVar1 = (sdg->super_DistanceGraph).links.
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (sdg->super_DistanceGraph).links.
             super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
    std::vector<Link,_std::allocator<Link>_>::vector
              ((vector<Link,_std::allocator<Link>_> *)&local_48,__x);
    for (pLVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
        pLVar2 != local_48._M_impl.super__Vector_impl_data._M_finish; pLVar2 = pLVar2 + 1) {
    }
    std::_Vector_base<Link,_std::allocator<Link>_>::~_Vector_base(&local_48);
  }
  poVar3 = std::operator<<(os,"SequenceDistanceGraph ");
  poVar3 = std::operator<<(poVar3,(string *)&(sdg->super_DistanceGraph).name);
  poVar3 = std::operator<<(poVar3,": ");
  SequenceDistanceGraph::count_active_nodes(sdg);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," nodes, ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," links");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const SequenceDistanceGraph &sdg) {
    uint64_t linkcount = 0;
    for (auto lv:sdg.links)
        for (auto l:lv)
            if (llabs(l.source) <= llabs(l.dest)) ++linkcount;

    os <<"SequenceDistanceGraph " << sdg.name <<": "<< sdg.count_active_nodes() <<" nodes, " << linkcount << " links";
    return os;
}